

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O1

void __thiscall
f8n::runtime::MessageQueue::Enqueue(MessageQueue *this,IMessagePtr *message,int64_t delayMs)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  long lVar4;
  _List_node_base *p_Var5;
  _Self __tmp;
  _List_node_base *p_Var6;
  long lVar7;
  
  lVar7 = 0;
  if (0 < delayMs) {
    lVar7 = delayMs;
  }
  lVar4 = std::chrono::_V2::system_clock::now();
  p_Var6 = (_List_node_base *)(lVar4 / 1000000 + lVar7);
  p_Var5 = (_List_node_base *)operator_new(0x18);
  p_Var5->_M_next = (_List_node_base *)0x0;
  p_Var5->_M_prev = (_List_node_base *)0x0;
  p_Var5[1]._M_next = (_List_node_base *)0x0;
  p_Var5->_M_next =
       (_List_node_base *)
       (message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var5->_M_prev,
             &(message->super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  p_Var5[1]._M_next = p_Var6;
  p_Var2 = (this->queue).
           super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  p_Var3 = p_Var2;
  while ((p_Var3 != (_List_node_base *)&this->queue &&
         ((long)p_Var3[1]._M_next[1]._M_next <= (long)p_Var6))) {
    p_Var3 = p_Var3->_M_next;
  }
  p_Var6 = (_List_node_base *)operator_new(0x18);
  p_Var6[1]._M_next = p_Var5;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  psVar1 = &(this->queue).
            super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (*psVar1 != 0) {
    LOCK();
    (this->nextMessageTime).super___atomic_base<long>._M_i =
         (__int_type)
         (this->queue).
         super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
         ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[1]._M_next;
    UNLOCK();
  }
  if (p_Var3 != p_Var2) {
    return;
  }
  std::_V2::condition_variable_any::notify_all(&this->waitForDispatch);
  return;
}

Assistant:

void MessageQueue::Enqueue(IMessagePtr message, int64_t delayMs) {
    delayMs = std::max((int64_t) 0, delayMs);

    milliseconds now = duration_cast<milliseconds>(
        system_clock::now().time_since_epoch());

    EnqueuedMessage *m = new EnqueuedMessage();
    m->message = message;
    m->time = now + milliseconds(delayMs);

    /* the queue is time ordered. start from the front of the queue, and
    work our way back until we find the correct place to insert the new one */

    typedef std::list<EnqueuedMessage*>::iterator Iterator;
    Iterator curr = this->queue.begin();

    while (curr != this->queue.end()) {
        if ((*curr)->time <= m->time) {
            curr++;
        }
        else {
            break;
        }
    }

    bool first = (curr == this->queue.begin());

    this->queue.insert(curr, m);

    if (this->queue.size()) {
        this->nextMessageTime.store((*this->queue.begin())->time.count());
    }

    if (first) {
        this->waitForDispatch.notify_all();
    }
}